

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TangentFixedRadiusArc.cpp
# Opt level: O0

int GeoCalcs::TangentFixedRadiusArc
              (LLPoint *pt1,double crs12,LLPoint *pt3,double crs3,double radius,int *dir,
              LLPoint *centerPt,LLPoint *tanPt1,LLPoint *tanPt2,double dTol)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  LLPoint LVar8;
  double local_140;
  bool local_132;
  double local_118;
  double local_110;
  double local_108;
  double dDistFromPt;
  double dCrsFromPt;
  double local_f0;
  LLPoint local_e8;
  double local_d8;
  double dErr;
  undefined1 auStack_c8 [4];
  int k;
  LLPoint endPt;
  LLPoint startPt;
  double distToStart;
  double vertexAngle;
  double crs21;
  double dist12;
  InverseResult result;
  LLPoint pt2;
  double dTol_local;
  LLPoint *tanPt2_local;
  LLPoint *tanPt1_local;
  LLPoint *centerPt_local;
  int *dir_local;
  double radius_local;
  double crs3_local;
  LLPoint *pt3_local;
  double crs12_local;
  LLPoint *pt1_local;
  
  LLPOINT::LLPOINT((LLPOINT *)&result.distance);
  bVar2 = CrsIntersect(pt1,crs12,pt3,crs3 + 3.141592653589793,dTol,(LLPoint *)&result.distance);
  if (bVar2) {
    INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&dist12);
    DistVincenty(pt1,(LLPoint *)&result.distance,(InverseResult *)&dist12);
    dVar1 = result.reverseAzimuth;
    DistVincenty((LLPoint *)&result.distance,pt1,(InverseResult *)&dist12);
    dVar4 = dist12;
    DistVincenty((LLPoint *)&result.distance,pt3,(InverseResult *)&dist12);
    dVar4 = SignAzimuthDifference(dVar4,dist12);
    dVar5 = sin(dVar4);
    if (dTol <= ABS(dVar5)) {
      iVar3 = 1;
      if (0.0 < dVar4) {
        iVar3 = -1;
      }
      *dir = iVar3;
      dVar5 = kSphereRadius;
      if (radius <= ABS((kSphereRadius * dVar4) / 2.0)) {
        dVar6 = tan(radius / kSphereRadius);
        dVar7 = tan(dVar4 / 2.0);
        dVar6 = asin(dVar6 / dVar7);
        startPt.longitude = dVar1 - ABS(dVar5 * dVar6);
        LLPOINT::LLPOINT((LLPOINT *)&endPt.longitude);
        LLPOINT::LLPOINT((LLPOINT *)auStack_c8);
        dErr._4_4_ = 0;
        local_d8 = 0.0;
        while( true ) {
          dVar1 = local_d8;
          local_132 = true;
          if (dErr._4_4_ != 0) {
            local_132 = dTol < ABS(local_d8) && dErr._4_4_ < 0xb;
          }
          if (!local_132) break;
          dVar5 = sin(dVar4);
          startPt.longitude = startPt.longitude - dVar1 / ABS(dVar5);
          local_e8 = DestVincenty(pt1,crs12,startPt.longitude);
          endPt.longitude = local_e8.latitude;
          startPt.latitude = local_e8.longitude;
          DistVincenty((LLPoint *)&endPt.longitude,(LLPoint *)&result.distance,
                       (InverseResult *)&dist12);
          local_140 = 1.5707963267948966;
          if (-1 < *dir) {
            local_140 = -1.5707963267948966;
          }
          dist12 = local_140 + dist12;
          _dCrsFromPt = DestVincenty((LLPoint *)&endPt.longitude,dist12,radius);
          centerPt->latitude = dCrsFromPt;
          centerPt->longitude = local_f0;
          LVar8 = PerpIntercept(pt3,crs3 + 3.141592653589793,centerPt,&dDistFromPt,&local_108,dTol);
          local_118 = LVar8.latitude;
          _auStack_c8 = local_118;
          local_110 = LVar8.longitude;
          endPt.latitude = local_110;
          DistVincenty(centerPt,(LLPoint *)auStack_c8,(InverseResult *)&dist12);
          local_d8 = radius - result.reverseAzimuth;
          dErr._4_4_ = dErr._4_4_ + 1;
        }
        tanPt1->latitude = endPt.longitude;
        tanPt1->longitude = startPt.latitude;
        tanPt2->latitude = _auStack_c8;
        tanPt2->longitude = endPt.latitude;
        DistVincenty((LLPoint *)&result.distance,tanPt2,(InverseResult *)&dist12);
        dVar4 = SignAzimuthDifference(dist12,crs3);
        pt1_local._4_4_ = (uint)(ABS(dVar4) <= 1.5707963267948966);
      }
      else {
        pt1_local._4_4_ = 0;
      }
    }
    else {
      pt1_local._4_4_ = 0;
    }
  }
  else {
    pt1_local._4_4_ = 0;
  }
  return pt1_local._4_4_;
}

Assistant:

int TangentFixedRadiusArc(const LLPoint &pt1, double crs12, const LLPoint &pt3,
                              double crs3, double radius, int &dir,
                              LLPoint &centerPt, LLPoint &tanPt1, LLPoint &tanPt2, double dTol)
    {
        LLPoint pt2;
        if (!CrsIntersect(pt1, crs12, pt3, crs3 + M_PI, dTol, pt2))
            return 0;

        InverseResult result;
        DistVincenty(pt1, pt2, result);
        const double dist12 = result.distance;

        DistVincenty(pt2, pt1, result);
        const double crs21 = result.azimuth;

        DistVincenty(pt2, pt3, result);
        const double vertexAngle = SignAzimuthDifference(crs21, result.azimuth);

        if (fabs(sin(vertexAngle)) < dTol)
            return 0;

        dir = vertexAngle > 0.0 ? -1 : 1;

        if (radius > fabs(kSphereRadius * vertexAngle / 2.0))
            return 0;

        double distToStart = dist12 - fabs(kSphereRadius *
                                           asin(tan(radius / kSphereRadius) / tan(vertexAngle / 2.0)));
        LLPoint startPt, endPt;
        int k = 0;
        double dErr = 0.0;
        while (k == 0 || (fabs(dErr) > dTol && k <= 10))
        {
            distToStart = distToStart - dErr / fabs(sin(vertexAngle));
            startPt = DestVincenty(pt1, crs12, distToStart);
            DistVincenty(startPt, pt2, result);
            result.azimuth += dir < 0 ? M_PI_2 : -M_PI_2;
            centerPt = DestVincenty(startPt, result.azimuth, radius);

            double dCrsFromPt, dDistFromPt;
            endPt = PerpIntercept(pt3, crs3 + M_PI, centerPt, dCrsFromPt, dDistFromPt, dTol);
            DistVincenty(centerPt, endPt, result);
            dErr = radius - result.distance;
            k++;
        }
        tanPt1 = startPt;
        tanPt2 = endPt;

        DistVincenty(pt2, tanPt2, result);

        return fabs(SignAzimuthDifference(result.azimuth, crs3)) <= M_PI_2;
    }